

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::operator==(json *this,json *other)

{
  json_exception *this_00;
  double dVar1;
  double dVar2;
  json *other_local;
  json *this_local;
  
  if (this->m_type == other->m_type) {
    switch(this->m_type) {
    case object_e:
      this_local._7_1_ = object_equal(this,other);
      break;
    case array_e:
      this_local._7_1_ = array_equal(this,other);
      break;
    case boolean_e:
      this_local._7_1_ = ((this->m_value).u_boolean & 1U) == ((other->m_value).u_boolean & 1U);
      break;
    case null_e:
      this_local._7_1_ = true;
      break;
    case number_int_e:
      this_local._7_1_ = number_equal(this,other);
      break;
    case number_double_e:
      this_local._7_1_ = number_equal(this,other);
      break;
    case string_e:
      this_local._7_1_ = string_equal(this,other);
      break;
    default:
      this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
      json_exception::json_exception(this_00,invalid_json_type_e);
      __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
    }
  }
  else if (((this->m_type == number_int_e) && (other->m_type == number_double_e)) ||
          ((this->m_type == number_double_e && (other->m_type == number_int_e)))) {
    dVar1 = operator_cast_to_double(this);
    dVar2 = operator_cast_to_double(other);
    this_local._7_1_ = dVar1 == dVar2;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool json::operator==(const json &other) const
{
    if (m_type == other.m_type)
    {
        switch (m_type)
        {
        case object_e:
            return object_equal(other);
        case array_e:
            return array_equal(other);
        case boolean_e:
            return m_value.u_boolean == other.m_value.u_boolean;
        case null_e:
            return true;
        case number_int_e:
            return number_equal(other);
        case number_double_e:
            return number_equal(other);
        case string_e:
            return string_equal(other);
        default:
            throw json_exception(json_exception::invalid_json_type_e);
        }
    }
    else if ((m_type == number_int_e && other.m_type == number_double_e) ||
             (m_type == number_double_e && other.m_type == number_int_e))
    {
        return static_cast<double>(*this) == static_cast<double>(other);
    }
    else
    {
        return false;
    }
}